

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsSeqReverse(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  long lVar7;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x1ea,"Vec_Ptr_t *Abc_NtkDfsSeqReverse(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar6 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar6) {
      piVar3 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar6;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar6;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vNodes->pArray = ppvVar4;
    pVVar5 = pNtk->vPis;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        Abc_NtkDfsSeqReverse_rec((Abc_Obj_t *)pVVar5->pArray[lVar7],vNodes);
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vPis;
      } while (lVar7 < pVVar5->nSize);
    }
    pVVar5 = pNtk->vPos;
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        Abc_NtkDfsSeq_rec((Abc_Obj_t *)pVVar5->pArray[lVar7],vNodes);
        lVar7 = lVar7 + 1;
        pVVar5 = pNtk->vPos;
      } while (lVar7 < pVVar5->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsSeqReverse( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDfsSeqReverse_rec( pObj, vNodes );
    // mark the logic feeding into POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsSeq_rec( pObj, vNodes );
    return vNodes;
}